

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O0

int secp256k1_fe_set_b32_limit(secp256k1_fe *r,uchar *a)

{
  int iVar1;
  uchar *in_RSI;
  secp256k1_fe *in_RDI;
  uint local_4;
  
  iVar1 = secp256k1_fe_impl_set_b32_limit(in_RDI,in_RSI);
  if (iVar1 == 0) {
    in_RDI->magnitude = -1;
  }
  else {
    in_RDI->magnitude = 1;
    in_RDI->normalized = 1;
    secp256k1_fe_verify(in_RDI);
  }
  local_4 = (uint)(iVar1 != 0);
  return local_4;
}

Assistant:

SECP256K1_INLINE static int secp256k1_fe_set_b32_limit(secp256k1_fe *r, const unsigned char *a) {
    if (secp256k1_fe_impl_set_b32_limit(r, a)) {
        r->magnitude = 1;
        r->normalized = 1;
        secp256k1_fe_verify(r);
        return 1;
    } else {
        /* Mark the output field element as invalid. */
        r->magnitude = -1;
        return 0;
    }
}